

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testSendOnSocket(int count,short port)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  int i;
  int iVar4;
  MemoryStoreFactory factory;
  TestApplication application;
  SessionSettings settings;
  ScreenLogFactory logFactory;
  TransactTime transactTime;
  Side side;
  Symbol symbol;
  HandlInst handlInst;
  ClOrdID clOrdID;
  OrdType ordType;
  SocketAcceptor acceptor;
  SocketInitiator initiator;
  stringstream stream;
  NewOrderSingle message;
  SessionID sessionID;
  allocator<char> local_e12;
  allocator<char> local_e11;
  code *local_e10;
  Application local_e08;
  int local_e00;
  SessionSettings local_df8;
  string local_d68 [5];
  FieldBase local_cc8;
  FieldBase local_c68;
  FieldBase local_c08;
  FieldBase local_ba8;
  FieldBase local_b48;
  FieldBase local_ae8;
  string local_a88 [13];
  STRING local_8e8 [35];
  stringstream local_470 [16];
  ostream local_460 [376];
  NewOrderSingle local_2e8;
  SessionID local_190;
  
  std::__cxx11::stringstream::stringstream(local_470);
  poVar1 = std::operator<<(local_460,"[DEFAULT]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"SocketConnectHost=localhost");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"SocketConnectPort=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,port);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"SocketAcceptPort=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,port);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"SocketReuseAddress=Y");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"StartTime=00:00:00");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"EndTime=00:00:00");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"UseDataDictionary=N");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"BeginString=FIX.4.2");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"PersistMessages=N");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"[SESSION]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"ConnectionType=acceptor");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"SenderCompID=SERVER");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"TargetCompID=CLIENT");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"[SESSION]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"ConnectionType=initiator");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"SenderCompID=CLIENT");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"TargetCompID=SERVER");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"HeartBtInt=30");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_8e8,"ORDERID",(allocator<char> *)local_a88);
  FIX::ClOrdID::ClOrdID((ClOrdID *)&local_b48,local_8e8);
  std::__cxx11::string::~string((string *)local_8e8);
  local_8e8[0]._M_dataplus._M_p._0_1_ = 0x31;
  FIX::HandlInst::HandlInst((HandlInst *)&local_ba8,(CHAR *)local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_8e8,"LNUX",(allocator<char> *)local_a88);
  FIX::Symbol::Symbol((Symbol *)&local_c08,local_8e8);
  std::__cxx11::string::~string((string *)local_8e8);
  FIX::Side::Side((Side *)&local_c68,"11");
  FIX::TransactTime::TransactTime((TransactTime *)&local_cc8);
  FIX::OrdType::OrdType((OrdType *)&local_ae8,"1");
  FIX42::NewOrderSingle::NewOrderSingle
            (&local_2e8,(ClOrdID *)&local_b48,(HandlInst *)&local_ba8,(Symbol *)&local_c08,
             (Side *)&local_c68,(TransactTime *)&local_cc8,(OrdType *)&local_ae8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_8e8,"FIX.4.2",(allocator<char> *)&local_e08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a88,"CLIENT",(allocator<char> *)&local_e10);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d68,"SERVER",&local_e11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_df8,"",&local_e12);
  FIX::SessionID::SessionID(&local_190,local_8e8,local_a88,local_d68,(string *)&local_df8);
  std::__cxx11::string::~string((string *)&local_df8);
  std::__cxx11::string::~string((string *)local_d68);
  std::__cxx11::string::~string((string *)local_a88);
  std::__cxx11::string::~string((string *)local_8e8);
  local_e08._vptr_Application = (_func_int **)&PTR__Application_0011bcc0;
  local_e00 = 0;
  local_e10 = FIX::FieldMap::FieldMap;
  FIX::SessionSettings::SessionSettings(&local_df8,(istream *)local_470,false);
  FIX::ScreenLogFactory::ScreenLogFactory((ScreenLogFactory *)local_d68,&local_df8);
  FIX::SocketAcceptor::SocketAcceptor
            ((SocketAcceptor *)local_a88,&local_e08,(MessageStoreFactory *)&local_e10,&local_df8);
  FIX::Acceptor::start();
  FIX::SocketInitiator::SocketInitiator
            ((SocketInitiator *)local_8e8,&local_e08,(MessageStoreFactory *)&local_e10,&local_df8);
  FIX::Initiator::start();
  FIX::process_sleep(1.0);
  lVar2 = GetTickCount();
  for (iVar4 = 0; iVar4 <= count; iVar4 = iVar4 + 1) {
    FIX::Session::sendToTarget((Message *)&local_2e8,&local_190);
  }
  while (local_e00 < count) {
    FIX::process_sleep(0.1);
  }
  lVar3 = GetTickCount();
  FIX::Initiator::stop(SUB81(local_8e8,0));
  FIX::Acceptor::stop(SUB81(local_a88,0));
  FIX::SocketInitiator::~SocketInitiator((SocketInitiator *)local_8e8);
  FIX::SocketAcceptor::~SocketAcceptor((SocketAcceptor *)local_a88);
  FIX::ScreenLogFactory::~ScreenLogFactory((ScreenLogFactory *)local_d68);
  FIX::SessionSettings::~SessionSettings(&local_df8);
  FIX::SessionID::~SessionID(&local_190);
  FIX::Message::~Message((Message *)&local_2e8);
  FIX::FieldBase::~FieldBase(&local_ae8);
  FIX::FieldBase::~FieldBase(&local_cc8);
  FIX::FieldBase::~FieldBase(&local_c68);
  FIX::FieldBase::~FieldBase(&local_c08);
  FIX::FieldBase::~FieldBase(&local_ba8);
  FIX::FieldBase::~FieldBase(&local_b48);
  std::__cxx11::stringstream::~stringstream(local_470);
  return lVar3 - lVar2;
}

Assistant:

long testSendOnSocket( int count, short port )
{
  std::stringstream stream;
  stream
    << "[DEFAULT]" << std::endl
    << "SocketConnectHost=localhost" << std::endl
    << "SocketConnectPort=" << (unsigned short)port << std::endl
    << "SocketAcceptPort=" << (unsigned short)port << std::endl
    << "SocketReuseAddress=Y" << std::endl
    << "StartTime=00:00:00" << std::endl
    << "EndTime=00:00:00" << std::endl
    << "UseDataDictionary=N" << std::endl
    << "BeginString=FIX.4.2" << std::endl
    << "PersistMessages=N" << std::endl
    << "[SESSION]" << std::endl
    << "ConnectionType=acceptor" << std::endl
    << "SenderCompID=SERVER" << std::endl
    << "TargetCompID=CLIENT" << std::endl
    << "[SESSION]" << std::endl
    << "ConnectionType=initiator" << std::endl
    << "SenderCompID=CLIENT" << std::endl
    << "TargetCompID=SERVER" << std::endl
    << "HeartBtInt=30" << std::endl;

  FIX::ClOrdID clOrdID( "ORDERID" );
  FIX::HandlInst handlInst( '1' );
  FIX::Symbol symbol( "LNUX" );
  FIX::Side side( FIX::Side_BUY );
  FIX::TransactTime transactTime;
  FIX::OrdType ordType( FIX::OrdType_MARKET );
  FIX42::NewOrderSingle message( clOrdID, handlInst, symbol, side, transactTime, ordType );

  FIX::SessionID sessionID( "FIX.4.2", "CLIENT", "SERVER" );

  TestApplication application;
  FIX::MemoryStoreFactory factory;
  FIX::SessionSettings settings( stream );
  FIX::ScreenLogFactory logFactory( settings );

  FIX::SocketAcceptor acceptor( application, factory, settings );
  acceptor.start();

  FIX::SocketInitiator initiator( application, factory, settings );
  initiator.start();

  FIX::process_sleep( 1 );

  long start = GetTickCount();

  for ( int i = 0; i <= count; ++i )
    FIX::Session::sendToTarget( message, sessionID );

  while( application.getCount() < count )
    FIX::process_sleep( 0.1 );

  long ticks = GetTickCount() - start;

  initiator.stop();
  acceptor.stop();

  return ticks;
}